

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapt_slots.cpp
# Opt level: O3

int main(void)

{
  slot<void_()> *value;
  slot<void_(int)> *value_00;
  slot<int_()> *value_01;
  slot<int_(int)> *value_02;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  __sighandler_t __handler_02;
  int __sig;
  int *piVar1;
  int i;
  signal<int_(int)> d;
  signal<int_()> c;
  signal<void_(int)> b;
  signal<void_()> a;
  int local_1f0 [2];
  signal<int_(int)> local_1e8;
  signal<int_()> local_170;
  signal<void_(int)> local_f8;
  signal<void_()> local_80;
  
  local_1f0[1] = 0;
  local_80.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00109b88;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_80.m_slots.m_first._0_5_ = 0;
  local_80.m_slots.m_first._5_3_ = 0;
  local_80.m_slots.m_last._0_5_ = 0;
  local_80.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_80.m_slots.m_delete_cv);
  value = (slot<void_()> *)operator_new(0x28);
  (value->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00109bd8;
  *(undefined8 *)((long)&(value->f).super__Function_base._M_functor + 8) = 0;
  piVar1 = local_1f0 + 1;
  *(int **)&(value->f).super__Function_base._M_functor = piVar1;
  (value->f)._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp:17:39)>
       ::_M_invoke;
  (value->f).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp:17:39)>
       ::_M_manager;
  obs::safe_list<obs::slot<void_()>_>::push_back(&local_80.m_slots,value);
  local_f8.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00109c60;
  local_f8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_f8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_f8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_f8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_f8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_f8.m_slots.m_first._0_5_ = 0;
  local_f8.m_slots.m_first._5_3_ = 0;
  local_f8.m_slots.m_last._0_5_ = 0;
  local_f8.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_f8.m_slots.m_delete_cv);
  value_00 = (slot<void_(int)> *)operator_new(0x28);
  (value_00->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00109ca0;
  *(undefined8 *)((long)&(value_00->f).super__Function_base._M_functor + 8) = 0;
  *(int **)&(value_00->f).super__Function_base._M_functor = piVar1;
  (value_00->f)._M_invoker =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h:70:17)>
       ::_M_invoke;
  (value_00->f).super__Function_base._M_manager =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h:70:17)>
       ::_M_manager;
  obs::safe_list<obs::slot<void_(int)>_>::push_back(&local_f8.m_slots,value_00);
  local_170.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00109cd8;
  local_170.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_170.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_170.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_170.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_170.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_170.m_slots.m_first._0_5_ = 0;
  local_170.m_slots.m_first._5_3_ = 0;
  local_170.m_slots.m_last._0_5_ = 0;
  local_170.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_170.m_slots.m_delete_cv);
  value_01 = (slot<int_()> *)operator_new(0x28);
  (value_01->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00109d18;
  *(undefined8 *)((long)&(value_01->f).super__Function_base._M_functor + 8) = 0;
  *(int **)&(value_01->f).super__Function_base._M_functor = piVar1;
  (value_01->f)._M_invoker =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp:19:39)>
       ::_M_invoke;
  (value_01->f).super__Function_base._M_manager =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp:19:39)>
       ::_M_manager;
  obs::safe_list<obs::slot<int_()>_>::push_back(&local_170.m_slots,value_01);
  local_1e8.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00109d50;
  local_1e8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_1e8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_1e8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_1e8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_1e8.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_1e8.m_slots.m_first._0_5_ = 0;
  local_1e8.m_slots.m_first._5_3_ = 0;
  local_1e8.m_slots.m_last._0_5_ = 0;
  local_1e8.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_1e8.m_slots.m_delete_cv);
  value_02 = (slot<int_(int)> *)operator_new(0x28);
  (value_02->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00109d90;
  *(undefined8 *)((long)&(value_02->f).super__Function_base._M_functor + 8) = 0;
  *(int **)&(value_02->f).super__Function_base._M_functor = piVar1;
  (value_02->f)._M_invoker =
       std::
       _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h:44:17)>
       ::_M_invoke;
  (value_02->f).super__Function_base._M_manager =
       std::
       _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h:44:17)>
       ::_M_manager;
  obs::safe_list<obs::slot<int_(int)>_>::push_back(&local_1e8.m_slots,value_02);
  obs::signal<void_()>::operator()<>(&local_80);
  local_1f0[0] = 1;
  obs::signal<void(int)>::operator()((signal<void(int)> *)&local_f8,local_1f0);
  obs::signal<int_()>::operator()<>(&local_170);
  local_1f0[0] = 1;
  obs::signal<int(int)>::operator()((signal<int(int)> *)&local_1e8,local_1f0);
  local_1f0[0] = 4;
  piVar1 = local_1f0 + 1;
  expect_eq<int,int>(local_1f0,piVar1,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp"
                     ,0x1a);
  __sig = (int)piVar1;
  obs::signal<int_(int)>::~signal(&local_1e8,__sig,__handler);
  obs::signal<int_()>::~signal(&local_170,__sig,__handler_00);
  obs::signal<void_(int)>::~signal(&local_f8,__sig,__handler_01);
  obs::signal<void_()>::~signal(&local_80,__sig,__handler_02);
  return 0;
}

Assistant:

int main() {
  static_assert(true == obs::is_callable_without_args<void()>::value, "");
  static_assert(true == obs::is_callable_without_args<int()>::value, "");
  static_assert(false == obs::is_callable_without_args<void(int)>::value, "");
  static_assert(false == obs::is_callable_without_args<int(int)>::value, "");

  int i = 0;
  obs::signal<void()   > a; a.connect([&i]{ ++i; });
  obs::signal<void(int)> b; b.connect([&i]{ ++i; });
  obs::signal<int ()   > c; c.connect([&i]{ return ++i; });
  obs::signal<int (int)> d; d.connect([&i]{ return ++i; });

  a();
  b(1);
  c();
  d(1);
  EXPECT_EQ(4, i);
}